

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLib.h
# Opt level: O0

void Abc_SclTimingsFree(SC_Timings *p)

{
  int iVar1;
  SC_Timing *p_00;
  int local_1c;
  int i;
  SC_Timing *pTemp;
  SC_Timings *p_local;
  
  for (local_1c = 0; iVar1 = Vec_PtrSize(&p->vTimings), local_1c < iVar1; local_1c = local_1c + 1) {
    p_00 = (SC_Timing *)Vec_PtrEntry(&p->vTimings,local_1c);
    Abc_SclTimingFree(p_00);
  }
  Vec_PtrErase(&p->vTimings);
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  if (p != (SC_Timings *)0x0) {
    free(p);
  }
  return;
}

Assistant:

static inline void Abc_SclTimingsFree( SC_Timings * p )
{
    SC_Timing * pTemp;
    int i;
    Vec_PtrForEachEntry( SC_Timing *, &p->vTimings, pTemp, i )
        Abc_SclTimingFree( pTemp );
    Vec_PtrErase( &p->vTimings );
    ABC_FREE( p->pName );
    ABC_FREE( p );
}